

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzblockdiag.cpp
# Opt level: O2

int __thiscall
TPZBlockDiagonal<long_double>::Substitution
          (TPZBlockDiagonal<long_double> *this,TPZFMatrix<long_double> *B)

{
  long lVar1;
  long lVar2;
  longdouble *plVar3;
  long col;
  long rows;
  long lVar4;
  long lVar5;
  long local_e0;
  TPZFMatrix<long_double> BTemp;
  
  if ((this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fDecomposed != '\x01') {
    TPZMatrix<long_double>::Error
              ("virtual int TPZBlockDiagonal<long double>::Substitution(TPZFMatrix<TVar> *) const [TVar = long double]"
               ,"TPZBlockDiagonal::Decompose_LU is decomposed with other scheme");
  }
  lVar4 = (this->fBlockSize).fNElements;
  lVar2 = (B->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol;
  col = 0;
  if (lVar4 < 1) {
    lVar4 = col;
  }
  if (lVar2 < 1) {
    lVar2 = col;
  }
  for (; col != lVar2; col = col + 1) {
    local_e0 = 0;
    for (lVar5 = 0; lVar4 != lVar5; lVar5 = lVar5 + 1) {
      rows = (long)(this->fBlockSize).fStore[lVar5];
      if (rows != 0) {
        lVar1 = (this->fBlockPos).fStore[lVar5];
        plVar3 = TPZFMatrix<long_double>::operator()(B,local_e0,col);
        TPZFMatrix<long_double>::TPZFMatrix(&BTemp,rows,1,plVar3,rows);
        plVar3 = TPZVec<long_double>::begin(&this->fStorage);
        TPZFMatrix<long_double>::Substitution(plVar3 + lVar1,rows,&BTemp);
        local_e0 = local_e0 + rows;
        TPZFMatrix<long_double>::~TPZFMatrix(&BTemp);
      }
    }
  }
  return 1;
}

Assistant:

int
TPZBlockDiagonal<TVar>::Substitution( TPZFMatrix<TVar> *B) const
{
	if(this->fDecomposed != ELU) {
		TPZMatrix<TVar>::Error(__PRETTY_FUNCTION__,"TPZBlockDiagonal::Decompose_LU is decomposed with other scheme");
	}
	
	int64_t b,nb,pos,bsize,eq=0;
	nb = fBlockSize.NElements();
	int64_t c, nc = B->Cols();
	for(c=0; c<nc; c++) {
		eq = 0;
		for(b=0;b<nb; b++) {
			pos = fBlockPos[b];
			bsize = fBlockSize[b];
			if(!bsize) continue;
			TPZFMatrix<TVar> BTemp(bsize,1,&(B->operator()(eq,c)),bsize);
			TVar *ptr = fStorage.begin()+pos;
			TPZFMatrix<TVar>::Substitution(ptr,bsize,&BTemp);
			eq+= bsize;
		}
	}
	return 1;
}